

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
* __thiscall
Catch::
createShard<std::set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>>
          (set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
           *__return_storage_ptr__,Catch *this,
          set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
          *container,size_t shardCount,size_t shardIndex)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  long lVar3;
  unsigned_long *puVar4;
  long lVar5;
  iterator iVar6;
  _Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> __first;
  _Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> __last;
  _Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> endIterator;
  _Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> startIterator;
  size_t endIndex;
  size_t startIndex;
  size_t leftoverTests;
  size_t shardSize;
  size_t totalTestCount;
  size_t shardIndex_local;
  size_t shardCount_local;
  set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  *container_local;
  
  totalTestCount = shardCount;
  shardIndex_local = (size_t)container;
  shardCount_local = (size_t)this;
  container_local = __return_storage_ptr__;
  if (shardCount < container) {
    if (container ==
        (set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
         *)0x1) {
      std::
      set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
      ::set(__return_storage_ptr__,
            (set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
             *)this);
    }
    else {
      shardSize = std::
                  set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
                  ::size((set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
                          *)this);
      leftoverTests = shardSize / shardIndex_local;
      startIndex = shardSize % shardIndex_local;
      lVar3 = totalTestCount * leftoverTests;
      puVar4 = std::min<unsigned_long>(&totalTestCount,&startIndex);
      uVar1 = *puVar4;
      lVar5 = (totalTestCount + 1) * leftoverTests;
      startIterator._M_node = (_Base_ptr)(totalTestCount + 1);
      puVar4 = std::min<unsigned_long>((unsigned_long *)&startIterator,&startIndex);
      uVar2 = *puVar4;
      iVar6 = std::
              set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
              ::begin((set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
                       *)shardCount_local);
      __first = std::next<std::_Rb_tree_const_iterator<Catch::TestCaseHandle_const*>>
                          (iVar6._M_node,lVar3 + uVar1);
      iVar6 = std::
              set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
              ::begin((set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
                       *)shardCount_local);
      __last = std::next<std::_Rb_tree_const_iterator<Catch::TestCaseHandle_const*>>
                         (iVar6._M_node,lVar5 + uVar2);
      std::
      set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
      ::set<std::_Rb_tree_const_iterator<Catch::TestCaseHandle_const*>>
                ((set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
                  *)__return_storage_ptr__,__first,__last);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("shardCount > shardIndex",
                "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                ,0x26ba,
                "Container Catch::createShard(const Container &, const std::size_t, const std::size_t) [Container = std::set<const Catch::TestCaseHandle *>]"
               );
}

Assistant:

Container createShard(Container const& container, std::size_t const shardCount, std::size_t const shardIndex) {
        assert(shardCount > shardIndex);

        if (shardCount == 1) {
            return container;
        }

        const std::size_t totalTestCount = container.size();

        const std::size_t shardSize = totalTestCount / shardCount;
        const std::size_t leftoverTests = totalTestCount % shardCount;

        const std::size_t startIndex = shardIndex * shardSize + (std::min)(shardIndex, leftoverTests);
        const std::size_t endIndex = (shardIndex + 1) * shardSize + (std::min)(shardIndex + 1, leftoverTests);

        auto startIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(startIndex));
        auto endIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(endIndex));

        return Container(startIterator, endIterator);
    }